

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toFloat.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  ostream *poVar2;
  int i;
  uint uVar3;
  
  lVar1 = std::cout;
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 9;
  *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(lVar1 + -0x18)) =
       *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(lVar1 + -0x18)) & 0xffffffb5 | 8;
  std::operator<<((ostream *)&std::cout,
                  "//\n// This is an automatically generated file.\n// Do not edit.\n//\n\n");
  std::operator<<((ostream *)&std::cout,"{\n    ");
  for (uVar3 = 0; uVar3 != 0x10000; uVar3 = uVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"{0x");
    poVar2 = std::operator<<(poVar2,0x30);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 8;
    halfToFloat((unsigned_short)uVar3);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"}, ");
    if ((~uVar3 & 3) == 0) {
      std::operator<<((ostream *)&std::cout,"\n");
      if (uVar3 != 0xffff) {
        std::operator<<((ostream *)&std::cout,"    ");
      }
    }
  }
  std::operator<<((ostream *)&std::cout,"};\n");
  return 0;
}

Assistant:

int
main ()
{
    cout.precision (9);
    cout.setf (ios_base::hex, ios_base::basefield);

    cout << "//\n"
	    "// This is an automatically generated file.\n"
	    "// Do not edit.\n"
	    "//\n\n";

    cout << "{\n    ";

    const int iMax = (1 << 16);

    for (int i = 0; i < iMax; i++)
    {
	cout << "{0x" << setfill ('0') << setw (8) << halfToFloat (i) << "}, ";

	if (i % 4 == 3)
	{
	    cout << "\n";

	    if (i < iMax - 1)
		cout << "    ";
	}
    }

    cout << "};\n";
    return 0;
}